

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall llvm::Obj2YamlError::~Obj2YamlError(Obj2YamlError *this)

{
  *(undefined ***)this = &PTR__Obj2YamlError_011290d0;
  std::__cxx11::string::~string((string *)&this->ErrMsg);
  return;
}

Assistant:

Obj2YamlError(obj2yaml_error C) : Code(C) {}